

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_iso9660.c
# Opt level: O1

uchar * extra_next_record(ctl_extr_rec *ctl,int length)

{
  int iVar1;
  isoent *piVar2;
  extr_rec *peVar3;
  uint uVar4;
  uint uVar5;
  
  iVar1 = ctl->cur_len;
  extra_close_record(ctl,0x1c);
  ctl->use_extr = 1;
  if (ctl->bp == (uchar *)0x0) {
    piVar2 = ctl->isoent->parent;
    if ((piVar2->extr_rec_list).first == (extr_rec *)0x0) {
      peVar3 = (extr_rec *)0x0;
    }
    else {
      peVar3 = (extr_rec *)((piVar2->extr_rec_list).last + -0x101);
    }
    if ((peVar3 == (extr_rec *)0x0) || (0x7e4 < peVar3->offset)) {
      peVar3 = (extr_rec *)malloc(0x810);
      if (peVar3 == (extr_rec *)0x0) goto LAB_00177274;
      *(extr_rec **)peVar3 = (extr_rec *)0x0;
      peVar3->next = (extr_rec *)0x0;
      if ((piVar2->extr_rec_list).last == (extr_rec **)0x0) {
        (piVar2->extr_rec_list).last = &(piVar2->extr_rec_list).first;
      }
      *(piVar2->extr_rec_list).last = peVar3;
      (piVar2->extr_rec_list).last = &peVar3->next;
    }
    uVar4 = 0x7e4 - peVar3->offset;
    uVar5 = 0x7e3 - peVar3->offset;
    if ((uVar4 & 1) == 0) {
      uVar5 = uVar4;
    }
    ctl->limit = uVar5;
    (piVar2->extr_rec_list).current = peVar3;
  }
  else {
    ctl->ce_ptr = ctl->bp + (long)iVar1 + 1;
    piVar2 = ctl->isoent->parent;
    peVar3 = (piVar2->extr_rec_list).current;
    if (0x7e4 < peVar3->offset) {
      peVar3 = peVar3->next;
    }
    uVar4 = 0x7e4 - peVar3->offset;
    uVar5 = 0x7e3 - peVar3->offset;
    if ((uVar4 & 1) == 0) {
      uVar5 = uVar4;
    }
    ctl->limit = uVar5;
    ctl->extr_off = peVar3->offset;
    ctl->extr_loc = peVar3->location;
    (piVar2->extr_rec_list).current = peVar3;
    ctl->bp = peVar3->buf + (long)peVar3->offset + -1;
  }
LAB_00177274:
  ctl->cur_len = 0;
  if (ctl->limit < length) {
    extra_next_record(ctl,length);
  }
  return ctl->bp;
}

Assistant:

static unsigned char *
extra_next_record(struct ctl_extr_rec *ctl, int length)
{
	int cur_len = ctl->cur_len;/* save cur_len */

	/* Close the current extra record or Directory Record. */
	extra_close_record(ctl, RR_CE_SIZE);

	/* Get a next extra record. */
	ctl->use_extr = 1;
	if (ctl->bp != NULL) {
		/* Storing data into an extra record. */
		unsigned char *p;

		/* Save the pointer where a CE extension will be
		 * stored to. */
		ctl->ce_ptr = &ctl->bp[cur_len+1];
		p = extra_get_record(ctl->isoent,
		    &ctl->limit, &ctl->extr_off, &ctl->extr_loc);
		ctl->bp = p - 1;/* the base of bp offset is 1. */
	} else
		/* Calculating the size of an extra record. */
		(void)extra_get_record(ctl->isoent,
		    &ctl->limit, NULL, NULL);
	ctl->cur_len = 0;
	/* Check if an extra record is almost full.
	 * If so, get a next one. */
	if (extra_space(ctl) < length)
		(void)extra_next_record(ctl, length);

	return (ctl->bp);
}